

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

void Abc_SclPrintCells(SC_Lib *p,float SlewInit,float Gain,int fInvOnly,int fShort)

{
  uint uVar1;
  undefined8 *puVar2;
  size_t sVar3;
  SC_Cell *pClass;
  void *pvVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  uint uVar9;
  SC_Cell *pCell;
  undefined8 *puVar10;
  bool bVar11;
  float fVar12;
  float local_70;
  float PD;
  float LD;
  double local_60;
  int local_54;
  Vec_Ptr_t *local_50;
  SC_Lib *local_48;
  double local_40;
  double local_38;
  
  local_70 = SlewInit;
  local_54 = fInvOnly;
  if ((SlewInit == 0.0) && (!NAN(SlewInit))) {
    local_70 = Abc_SclComputeAverageSlew(p);
  }
  LD = 0.0;
  PD = 0.0;
  if ((p->vCellClasses).nSize < 1) {
    __assert_fail("Vec_PtrSize(&p->vCellClasses) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibUtil.c"
                  ,0x283,"void Abc_SclPrintCells(SC_Lib *, float, float, int, int)");
  }
  iVar5 = 0;
  printf("Library \"%s\" ",p->pName);
  printf("has %d cells in %d classes.  ",(ulong)(uint)(p->vCells).nSize,
         (ulong)(uint)(p->vCellClasses).nSize);
  local_60 = (double)Gain;
  if (fShort == 0) {
    printf("Delay estimate is based on slew %.2f ps and gain %.2f.",(double)local_70,local_60);
  }
  local_50 = &p->vCellClasses;
  putchar(10);
  Abc_SclMarkSkippedCells(p);
  uVar9 = 0;
  for (; iVar6 = (p->vCellClasses).nSize, iVar5 < iVar6; iVar5 = iVar5 + 1) {
    puVar2 = (undefined8 *)Vec_PtrEntry(local_50,iVar5);
    iVar6 = 0;
    for (puVar10 = puVar2; (bVar11 = iVar6 == 0, iVar6 = iVar6 + -1, bVar11 || (puVar10 != puVar2));
        puVar10 = (undefined8 *)puVar10[9]) {
      sVar3 = strlen((char *)*puVar2);
      uVar7 = (uint)sVar3;
      if ((int)(uint)sVar3 < (int)uVar9) {
        uVar7 = uVar9;
      }
      uVar9 = uVar7;
    }
  }
  local_60 = local_60 * 0.01;
  uVar7 = 0;
  local_48 = p;
  do {
    if (iVar6 <= (int)uVar7) {
      return;
    }
    pClass = (SC_Cell *)Vec_PtrEntry(local_50,uVar7);
    iVar5 = pClass->n_inputs;
    if (local_54 == 0) {
LAB_003b9836:
      do {
        if ((pClass->vPins).nSize <= iVar5) goto LAB_003b9aa2;
        pvVar4 = Vec_PtrEntry(&pClass->vPins,iVar5);
        if (iVar5 == pClass->n_inputs) {
          printf("Class%4d : ",(ulong)uVar7);
          uVar1 = Abc_SclClassCellNum(pClass);
          printf("Cells =%3d   ",(ulong)uVar1);
          printf("Ins =%2d  ",(ulong)(uint)pClass->n_inputs);
          printf("Outs =%2d  ",(ulong)(uint)pClass->n_outputs);
        }
        else {
          printf("                                            ");
        }
        if (*(long *)((long)pvVar4 + 0x28) != 0) {
          printf("%-30s");
        }
        printf("    ");
        Kit_DsdPrintFromTruth(*(uint **)((long)pvVar4 + 0x38),pClass->n_inputs);
        putchar(10);
        iVar5 = iVar5 + 1;
      } while (fShort != 0);
      uVar1 = 1;
      pCell = pClass;
      while( true ) {
        if (pCell == pClass && uVar1 != 1) break;
        printf("  %3d ",(ulong)uVar1);
        pcVar8 = "s";
        if (pCell->fSkip == 0) {
          pcVar8 = " ";
        }
        printf("%s",pcVar8);
        printf(" : ");
        printf("%-*s  ",(ulong)uVar9,pCell->pName);
        printf("%2d   ",(ulong)(uint)pCell->drive_strength);
        printf("A =%8.2f  ",(double)pCell->area);
        pcVar8 = "L =%8.2f  ";
        printf("L =%8.2f  ",(double)pCell->leakage);
        if (pCell->n_outputs == 1) {
          iVar5 = Abc_SclComputeParametersCell((SC_Lib *)pcVar8,pCell,local_70,&LD,&PD);
          if (iVar5 != 0) {
            local_40 = (double)LD;
            local_38 = (double)PD;
            printf("D =%6.1f ps  ",local_60 * local_40 + local_38);
            printf("LD =%6.1f ps  ",local_40);
            printf("PD =%6.1f ps    ",local_38);
            fVar12 = SC_CellPinCapAve(pCell);
            printf("C =%5.1f ff  ",(double)fVar12);
            pvVar4 = Vec_PtrEntry(&pCell->vPins,pCell->n_inputs);
            printf("Cm =%5.0f ff    ",(double)*(float *)((long)pvVar4 + 0x20));
            pvVar4 = Vec_PtrEntry(&pCell->vPins,pCell->n_inputs);
            printf("Sm =%5.1f ps ",(double)*(float *)((long)pvVar4 + 0x24));
          }
        }
        putchar(10);
        pCell = pCell->pNext;
        uVar1 = uVar1 + 1;
      }
    }
    else {
      bVar11 = iVar5 == 1;
      iVar5 = 1;
      if (bVar11) goto LAB_003b9836;
    }
LAB_003b9aa2:
    uVar7 = uVar7 + 1;
    iVar6 = (local_48->vCellClasses).nSize;
  } while( true );
}

Assistant:

void Abc_SclPrintCells( SC_Lib * p, float SlewInit, float Gain, int fInvOnly, int fShort )
{
    SC_Cell * pCell, * pRepr;
    SC_Pin * pPin;
    int i, j, k, nLength = 0;
    float Slew = (SlewInit == 0) ? Abc_SclComputeAverageSlew(p) : SlewInit;
    float LD = 0, PD = 0;
    assert( Vec_PtrSize(&p->vCellClasses) > 0 );
    printf( "Library \"%s\" ", p->pName );
    printf( "has %d cells in %d classes.  ", 
        Vec_PtrSize(&p->vCells), Vec_PtrSize(&p->vCellClasses) );
    if ( !fShort )
        printf( "Delay estimate is based on slew %.2f ps and gain %.2f.", Slew, Gain );
    printf( "\n" );
    Abc_SclMarkSkippedCells( p );
    // find the longest name
    SC_LibForEachCellClass( p, pRepr, k )
        SC_RingForEachCell( pRepr, pCell, i )
            nLength = Abc_MaxInt( nLength, strlen(pRepr->pName) );
    // print cells
    SC_LibForEachCellClass( p, pRepr, k )
    {
        if ( fInvOnly && pRepr->n_inputs != 1 )
            continue;
        SC_CellForEachPinOut( pRepr, pPin, i )
        {
            if ( i == pRepr->n_inputs )
            {
                printf( "Class%4d : ",   k );
                printf( "Cells =%3d   ", Abc_SclClassCellNum(pRepr) );
                printf( "Ins =%2d  ",    pRepr->n_inputs );
                printf( "Outs =%2d  ",   pRepr->n_outputs );
            }
            else
                printf( "                                            " );
            if ( pPin->func_text )
                printf( "%-30s", pPin->func_text  );
            printf( "    "  );
            Kit_DsdPrintFromTruth( (unsigned *)Vec_WrdArray(&pPin->vFunc), pRepr->n_inputs );
            printf( "\n" );
            if ( fShort )
                continue;
            SC_RingForEachCell( pRepr, pCell, j )
            {
                printf( "  %3d ",           j+1 );
                printf( "%s",               pCell->fSkip ? "s" : " " );
                printf( " : " );
                printf( "%-*s  ",           nLength, pCell->pName );
                printf( "%2d   ",           pCell->drive_strength );
                printf( "A =%8.2f  ",       pCell->area );
                printf( "L =%8.2f  ",       pCell->leakage );
                if ( pCell->n_outputs == 1 )
                {
                    if ( Abc_SclComputeParametersCell( p, pCell, Slew, &LD, &PD ) )
                    {
                        printf( "D =%6.1f ps  ",    0.01 * Gain * LD + PD );
                        printf( "LD =%6.1f ps  ",   LD );
                        printf( "PD =%6.1f ps    ", PD );
                        printf( "C =%5.1f ff  ",    SC_CellPinCapAve(pCell) );
                        printf( "Cm =%5.0f ff    ", SC_CellPin(pCell, pCell->n_inputs)->max_out_cap );
                        printf( "Sm =%5.1f ps ",    SC_CellPin(pCell, pCell->n_inputs)->max_out_slew );
                    }
                }
                printf( "\n" );
            }
            break;
        }
    }
}